

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O0

int os_is_file_in_dir(char *filename,char *path,int allow_subdirs,int match_self)

{
  int iVar1;
  size_t __n;
  size_t __n_00;
  char *__s;
  uint in_ECX;
  int in_EDX;
  bool bVar2;
  char *p;
  size_t plen;
  size_t flen;
  char path_buf [4096];
  char filename_buf [4096];
  undefined7 in_stack_ffffffffffffdfb8;
  undefined1 in_stack_ffffffffffffdfbf;
  char *in_stack_ffffffffffffdfc0;
  size_t in_stack_ffffffffffffdfc8;
  char *in_stack_ffffffffffffdfd0;
  char local_2028 [72];
  char *in_stack_ffffffffffffe020;
  char *in_stack_ffffffffffffe050;
  size_t in_stack_ffffffffffffe058;
  char *in_stack_ffffffffffffe060;
  char local_1028 [24];
  char *in_stack_ffffffffffffeff0;
  size_t in_stack_ffffffffffffeff8;
  char *in_stack_fffffffffffff000;
  uint local_4;
  
  iVar1 = os_is_file_absolute((char *)CONCAT17(in_stack_ffffffffffffdfbf,in_stack_ffffffffffffdfb8))
  ;
  if (iVar1 == 0) {
    os_get_abs_filename(in_stack_fffffffffffff000,in_stack_ffffffffffffeff8,
                        in_stack_ffffffffffffeff0);
  }
  iVar1 = os_is_file_absolute((char *)CONCAT17(in_stack_ffffffffffffdfbf,in_stack_ffffffffffffdfb8))
  ;
  if (iVar1 == 0) {
    os_get_abs_filename(in_stack_fffffffffffff000,in_stack_ffffffffffffeff8,
                        in_stack_ffffffffffffeff0);
  }
  safe_strcpy(in_stack_ffffffffffffdfd0,in_stack_ffffffffffffdfc8,in_stack_ffffffffffffdfc0);
  canonicalize_path(in_stack_ffffffffffffe020);
  resolve_path(in_stack_ffffffffffffe060,in_stack_ffffffffffffe058,in_stack_ffffffffffffe050);
  __s = local_1028;
  safe_strcpy(in_stack_ffffffffffffdfd0,in_stack_ffffffffffffdfc8,in_stack_ffffffffffffdfc0);
  canonicalize_path(in_stack_ffffffffffffe020);
  resolve_path(in_stack_ffffffffffffe060,in_stack_ffffffffffffe058,in_stack_ffffffffffffe050);
  __n = strlen(__s);
  __n_00 = strlen(local_2028);
  if ((__n_00 != 0) && (local_2028[__n_00 - 1] == '/')) {
    __n_00 = __n_00 - 1;
  }
  if ((__n_00 != __n) || (iVar1 = memcmp(__s,local_2028,__n), local_4 = in_ECX, iVar1 != 0)) {
    if ((__n < __n_00 + 2) || (iVar1 = memcmp(__s,local_2028,__n_00), iVar1 != 0)) {
      local_4 = 0;
    }
    else if (__s[__n_00] == '/') {
      if (in_EDX == 0) {
        while( true ) {
          bVar2 = false;
          if (*__s != '\0') {
            bVar2 = *__s != '/';
          }
          if (!bVar2) break;
          __s = __s + 1;
        }
        local_4 = (uint)(*__s == '\0');
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int
os_is_file_in_dir( const char* filename, const char* path,
                   int allow_subdirs, int match_self )
{
    char filename_buf[OSFNMAX], path_buf[OSFNMAX];
    size_t flen, plen;

    // Absolute-ize the filename, if necessary.
    if (not os_is_file_absolute(filename)) {
        os_get_abs_filename(filename_buf, sizeof(filename_buf), filename);
        filename = filename_buf;
    }

    // Absolute-ize the path, if necessary.
    if (not os_is_file_absolute(path)) {
        os_get_abs_filename(path_buf, sizeof(path_buf), path);
        path = path_buf;
    }

    // Canonicalize the paths, to remove .. and . elements - this will make
    // it possible to directly compare the path strings.  Also resolve it
    // to the extent possible, to make sure we're not fooled by symbolic
    // links.
    safe_strcpy(filename_buf, sizeof(filename_buf), filename);
    canonicalize_path(filename_buf);
    resolve_path(filename_buf, sizeof(filename_buf), filename_buf);
    filename = filename_buf;

    safe_strcpy(path_buf, sizeof(path_buf), path);
    canonicalize_path(path_buf);
    resolve_path(path_buf, sizeof(path_buf), path_buf);
    path = path_buf;

    // Get the length of the filename and the length of the path.
    flen = strlen(filename);
    plen = strlen(path);

    // If the path ends in a separator character, ignore that.
    if (plen > 0 and path[plen-1] == '/')
        --plen;

    // if the names match, return true if and only if we're matching the
    // directory to itself
    if (plen == flen && memcmp(filename, path, flen) == 0)
        return match_self;

    // Check that the filename has 'path' as its path prefix.  First, check
    // that the leading substring of the filename matches 'path', ignoring
    // case.  Note that we need the filename to be at least two characters
    // longer than the path: it must have a path separator after the path
    // name, and at least one character for a filename past that.
    if (flen < plen + 2 or memcmp(filename, path, plen) != 0)
        return false;

    // Okay, 'path' is the leading substring of 'filename'; next make sure
    // that this prefix actually ends at a path separator character in the
    // filename.  (This is necessary so that we don't confuse "c:\a\b.txt"
    // as matching "c:\abc\d.txt" - if we only matched the "c:\a" prefix,
    // we'd miss the fact that the file is actually in directory "c:\abc",
    // not "c:\a".)
    if (filename[plen] != '/')
        return false;

    // We're good on the path prefix - we definitely have a file that's
    // within the 'path' directory or one of its subdirectories.  If we're
    // allowed to match on subdirectories, we already have our answer
    // (true).  If we're not allowed to match subdirectories, we still have
    // one more check, which is that the rest of the filename is free of
    // path separator charactres.  If it is, we have a file that's directly
    // in the 'path' directory; otherwise it's in a subdirectory of 'path'
    // and thus isn't a match.
    if (allow_subdirs) {
        // Filename is in the 'path' directory or one of its
        // subdirectories, and we're allowed to match on subdirectories, so
        // we have a match.
        return true;
    }

    // We're not allowed to match subdirectories, so scan the rest of
    // the filename for path separators.  If we find any, the file is
    // in a subdirectory of 'path' rather than directly in 'path'
    // itself, so it's not a match.  If we don't find any separators,
    // we have a file directly in 'path', so it's a match.
    const char* p;
    for (p = filename; *p != '\0' and *p != '/' ; ++p)
        ;

    // If we reached the end of the string without finding a path
    // separator character, it's a match .
    return *p == '\0';
}